

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O0

RCOError __thiscall RCO::getCharTableChar(RCO *this,u16string *c,uint32_t offset,uint32_t len)

{
  char16_t *__s;
  ulong __n;
  allocator<char16_t> local_49;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_48;
  char16_t *local_28;
  char16_t *buf;
  uint32_t len_local;
  uint32_t offset_local;
  u16string *c_local;
  RCO *this_local;
  
  buf._0_4_ = len;
  buf._4_4_ = offset;
  _len_local = c;
  c_local = (u16string *)this;
  local_28 = (char16_t *)operator_new__((ulong)(len + 2) * 2);
  memset(local_28,0,(ulong)((uint32_t)buf + 2));
  memcpy(local_28,this->mBuffer + (ulong)(buf._4_4_ * 2) + (ulong)(this->mHeader).char_start_off,
         (ulong)(uint32_t)buf);
  __s = local_28;
  __n = (ulong)(uint32_t)buf;
  std::allocator<char16_t>::allocator(&local_49);
  std::__cxx11::u16string::u16string((u16string *)&local_48,__s,__n,&local_49);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  operator=(_len_local,&local_48);
  std::__cxx11::u16string::~u16string((u16string *)&local_48);
  std::allocator<char16_t>::~allocator(&local_49);
  if (local_28 != (char16_t *)0x0) {
    operator_delete__(local_28);
  }
  return NO_ERROR;
}

Assistant:

RCOError RCO::getCharTableChar(std::u16string &c, uint32_t offset, uint32_t len)
{
	char16_t *buf = new char16_t[len + 2];
	memset(buf, 0, len + 2);

	memcpy(buf, mBuffer + mHeader.char_start_off + (offset * 2), len);

	c = std::u16string(buf, len);

	delete[] buf;

	return NO_ERROR;
}